

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloatBitsToUintIntCaseInstance::compare
          (FloatBitsToUintIntCaseInstance *this,void **inputs,void **outputs)

{
  pointer pSVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  ulong uVar7;
  uint uVar8;
  
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  uVar2 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  uVar6 = ~(-1 << (0x17 - (&DAT_009ceaec)[(ulong)uVar6 * 4] & 0x1f));
  uVar7 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  do {
    if (uVar5 == uVar7) {
LAB_00785e28:
      return (long)(int)uVar2 <= (long)uVar7;
    }
    uVar4 = *(uint *)((long)*inputs + uVar7 * 4);
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar4;
    uVar4 = *(int *)((long)*outputs + uVar7 * 4) - uVar4;
    uVar8 = -uVar4;
    if (0 < (int)uVar4) {
      uVar8 = uVar4;
    }
    if ((int)uVar6 < (int)uVar8) {
      poVar3 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar7);
      poVar3 = std::operator<<(poVar3,"] = ");
      poVar3 = tcu::Format::operator<<(poVar3,hex);
      poVar3 = std::operator<<(poVar3," with threshold ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = uVar6;
      poVar3 = tcu::Format::operator<<(poVar3,hex_00);
      poVar3 = std::operator<<(poVar3,", got diff ");
      hex_01.value._4_4_ = 0;
      hex_01.value._0_4_ = uVar8;
      tcu::Format::operator<<(poVar3,hex_01);
      goto LAB_00785e28;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}